

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreIncompleteTexturesTest::Run
          (ImageLoadStoreIncompleteTexturesTest *this)

{
  CallLogWrapper *this_00;
  pointer puVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLuint index;
  uint uVar4;
  int iVar5;
  InternalError *this_01;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_texture_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  GLuint local_1c4;
  GLuint local_1c0;
  GLuint local_1bc;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  pointer local_1a8;
  ios_base local_140 [272];
  
  GVar2 = this->m_complete_destination_texture_id;
  local_1c4 = this->m_complete_source_texture_id;
  local_1c0 = this->m_incomplete_destination_texture_id;
  local_1bc = this->m_incomplete_source_texture_id;
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program_id);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fc2);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array_object_id);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fc6);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer_id);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fca);
  index = glu::CallLogWrapper::glGetAttribLocation(this_00,this->m_program_id,"vs_in_position");
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"GetAttribLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fce);
  if (index != 0xffffffff) {
    glu::CallLogWrapper::glVertexAttribPointer(this_00,index,4,0x1406,'\0',0,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"VertexAttribPointer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1fd6);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,index);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"EnableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1fd9);
    BindTextureToImage(this,this->m_program_id,GVar2,0,"u_complete_destination_image");
    BindTextureToImage(this,this->m_program_id,local_1c4,1,"u_complete_source_image");
    BindTextureToImage(this,this->m_program_id,local_1c0,2,"u_incomplete_destination_image");
    BindTextureToImage(this,this->m_program_id,local_1bc,3,"u_incomplete_source_image");
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1fe7);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
    GVar2 = this->m_incomplete_destination_texture_id;
    uVar10 = (ulong)(this->m_texture_edge * this->m_texture_edge * 4);
    local_1a8 = (pointer)0x0;
    local_1b8 = (undefined1  [8])0x0;
    pp_Stack_1b0 = (_func_int **)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,uVar10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1e8,uVar10);
    uVar4 = this->m_texture_edge;
    if (uVar4 != 0) {
      iVar6 = 0;
      uVar7 = 0;
      do {
        if (this->m_texture_edge != 0) {
          uVar4 = uVar4 * iVar6;
          uVar8 = 0;
          do {
            uVar9 = (ulong)uVar4;
            *(uchar *)((long)(qpTestLog **)local_1b8 + uVar9) = (uchar)uVar8;
            *(uchar *)((long)(qpTestLog **)local_1b8 + uVar9 + 1) = (uchar)uVar7;
            puVar1 = (pointer)((long)(qpTestLog **)local_1b8 + uVar9 + 2);
            puVar1[0] = '3';
            puVar1[1] = 0xcc;
            uVar8 = uVar8 + 1;
            uVar4 = uVar4 + 4;
          } while (uVar8 < this->m_texture_edge);
        }
        uVar7 = uVar7 + 1;
        uVar4 = this->m_texture_edge;
        iVar6 = iVar6 + 4;
      } while (uVar7 < uVar4);
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,GVar2);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1fa0);
    glu::CallLogWrapper::glGetTexImage
              (this_00,0xde1,0,0x1908,0x1401,
               local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1fa3);
    puVar1 = local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = bcmp(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,(void *)local_1b8,uVar10);
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)local_1e8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    if (local_1b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
    }
    if (iVar6 != 0) {
      local_1b8 = (undefined1  [8])
                  ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,
                 "Problem with imageStore, operation modified contents of incomplete texture",0x4a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    GVar2 = this->m_complete_destination_texture_id;
    uVar10 = (ulong)(this->m_texture_edge * this->m_texture_edge * 4);
    local_1a8 = (pointer)0x0;
    local_1b8 = (undefined1  [8])0x0;
    pp_Stack_1b0 = (_func_int **)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,uVar10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1e8,uVar10);
    if (uVar10 != 0) {
      uVar8 = 0;
      do {
        *(uchar *)((long)(qpTestLog **)local_1b8 + uVar8) = '\0';
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,GVar2);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1f72);
    glu::CallLogWrapper::glGetTexImage
              (this_00,0xde1,0,0x1908,0x1401,
               local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1f75);
    puVar1 = local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = bcmp(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,(void *)local_1b8,uVar10);
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)local_1e8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    if (local_1b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
    }
    if (iVar5 != 0) {
      local_1b8 = (undefined1  [8])
                  ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,
                 "Problem with imageLoad, operation returned non 0 result for incomplete texture",
                 0x4e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    return -(ulong)(iVar5 != 0 || iVar6 != 0);
  }
  this_01 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_01,"Attribute location is not available","vs_in_position",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
             ,0x1fd2);
  __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual long Run()
	{
		bool result = true;

		/* Copy textures data with imageLoad() and imageStore() operations */
		Copy2DRGBA8Textures(m_complete_destination_texture_id, m_incomplete_destination_texture_id,
							m_complete_source_texture_id, m_incomplete_source_texture_id);

		glMemoryBarrier(GL_ALL_BARRIER_BITS);

		/* Verify that store to "incomplete destination" was ignored */
		if (true ==
			CheckIfTextureWasModified(m_incomplete_destination_texture_id, m_incomplete_destination_magic_number))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Problem with imageStore, operation modified contents of incomplete texture"
				<< tcu::TestLog::EndMessage;

			result = false;
		}

		/* Verify that load from "incomplete source" returned 0 */
		if (false == CheckIfTextureIsBlack(m_complete_destination_texture_id))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Problem with imageLoad, operation returned non 0 result for incomplete texture"
				<< tcu::TestLog::EndMessage;

			result = false;
		}

		if (false == result)
		{
			return ERROR;
		}

		/* Done */
		return NO_ERROR;
	}